

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O3

void __thiscall
soplex::LPColSetBase<double>::add(LPColSetBase<double> *this,DataKey *pkey,LPColBase<double> *pcol)

{
  int local_1c;
  double local_18;
  double local_10;
  double local_8;
  
  local_8 = pcol->object;
  local_10 = pcol->low;
  local_18 = pcol->up;
  local_1c = 0;
  add(this,pkey,&local_8,&local_10,&(pcol->vec).super_SVectorBase<double>,&local_18,&local_1c);
  return;
}

Assistant:

void add(DataKey& pkey, const LPColBase<R>& pcol)
   {
      add(pkey, pcol.obj(), pcol.lower(), pcol.colVector(), pcol.upper());
   }